

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

bool __thiscall Omega_h::StateRowLess::operator()(StateRowLess *this,int *a,int *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  ConstRef pvVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  pvVar4 = at<int>(this->accepted,*a);
  iVar6 = *pvVar4;
  pvVar4 = at<int>(this->accepted,*b);
  iVar7 = *pvVar4;
  bVar8 = SBORROW4(iVar6,iVar7);
  iVar3 = iVar6 - iVar7;
  if (iVar6 == iVar7) {
    iVar7 = this->table->ncols;
    iVar6 = 0;
    if (iVar7 < 1) {
      iVar7 = iVar6;
    }
    do {
      if (iVar7 == iVar6) {
        return false;
      }
      pvVar5 = at<int>(this->table,*a,iVar6);
      iVar2 = *pvVar5;
      pvVar5 = at<int>(this->table,*b,iVar6);
      iVar6 = iVar6 + 1;
      iVar1 = *pvVar5;
      bVar8 = SBORROW4(iVar2,iVar1);
      iVar3 = iVar2 - iVar1;
    } while (iVar2 == iVar1);
  }
  return bVar8 != iVar3 < 0;
}

Assistant:

bool operator()(int const& a, int const& b) const {
    auto aa = at(accepted, a);
    auto ab = at(accepted, b);
    if (aa != ab) return aa < ab;
    for (int symbol = 0, ncols = get_ncols(table); symbol < ncols; ++symbol) {
      auto ea = at(table, a, symbol);
      auto eb = at(table, b, symbol);
      if (ea != eb) return ea < eb;
    }
    return false;
  }